

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.cpp
# Opt level: O0

void __thiscall
cppcms::session_interface::session_interface(session_interface *this,context *context)

{
  session_pool *psVar1;
  shared_ptr<cppcms::session_api> *this_00;
  context *in_RSI;
  session_interface *in_RDI;
  session_pool *this_01;
  
  booster::noncopyable::noncopyable((noncopyable *)in_RDI);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::session_interface::entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::session_interface::entry>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::session_interface::entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::session_interface::entry>_>_>
         *)0x43ec4f);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::session_interface::entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::session_interface::entry>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::session_interface::entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::session_interface::entry>_>_>
         *)0x43ec62);
  in_RDI->context_ = in_RSI;
  in_RDI->field_0x80 = in_RDI->field_0x80 & 0xf7;
  in_RDI->field_0x80 = in_RDI->field_0x80 & 0xef;
  in_RDI->field_0x80 = in_RDI->field_0x80 & 0xdf;
  in_RDI->field_0x80 = in_RDI->field_0x80 & 0xbf;
  in_RDI->field_0x80 = in_RDI->field_0x80 & 0x7f;
  std::__cxx11::string::string((string *)&in_RDI->temp_cookie_);
  std::shared_ptr<cppcms::session_api>::shared_ptr((shared_ptr<cppcms::session_api> *)0x43ecdd);
  psVar1 = (session_pool *)operator_new(0x10);
  _data::_data((_data *)psVar1);
  this_01 = psVar1;
  booster::hold_ptr<cppcms::session_interface::_data>::hold_ptr(&in_RDI->d,(_data *)psVar1);
  init(in_RDI,(EVP_PKEY_CTX *)psVar1);
  this_00 = (shared_ptr<cppcms::session_api> *)http::context::service((context *)0x43ed35);
  psVar1 = service::session_pool((service *)0x43ed46);
  session_pool::get(this_01);
  std::shared_ptr<cppcms::session_api>::operator=(this_00,(shared_ptr<cppcms::session_api> *)psVar1)
  ;
  std::shared_ptr<cppcms::session_api>::~shared_ptr((shared_ptr<cppcms::session_api> *)0x43ed7c);
  return;
}

Assistant:

session_interface::session_interface(http::context &context) :
	context_(&context),
	loaded_(0),
	reset_(0),
	csrf_checked_(0),
	csrf_do_validation_(0),
	csrf_validation_(0),
	d(new session_interface::_data())
{
	init();
	storage_=context_->service().session_pool().get();
}